

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogreadertest.hpp
# Opt level: O2

void __thiscall
CatalogReaderTest_testConstructorCourseHeirarchyCHE_Test::TestBody
          (CatalogReaderTest_testConstructorCourseHeirarchyCHE_Test *this)

{
  bool bVar1;
  AbstractMajor *major;
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_d8;
  CatalogReader reader;
  
  major = (AbstractMajor *)operator_new(0x40);
  ChemicalEngineering::ChemicalEngineering((ChemicalEngineering *)major);
  CatalogReader::CatalogReader(&reader,major);
  local_118 = &local_108;
  local_108 = 0;
  uStack_100 = 0;
  local_110 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    CatalogReader::createCourseHeirarchy_abi_cxx11_
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
                *)&local_d8,&reader);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_d8);
  }
  std::__cxx11::string::~string((string *)&local_118);
  CatalogReader::~CatalogReader(&reader);
  return;
}

Assistant:

TEST(CatalogReaderTest, testConstructorCourseHeirarchyCHE) {
    AbstractMajor* major = new ChemicalEngineering();

    CatalogReader reader(major);

    ASSERT_NO_THROW(reader.createCourseHeirarchy());
}